

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mctools_fileextension(mcu8str *path)

{
  char *c_str;
  mcu8str *in_RDI;
  char *it;
  
  c_str = mctools_fileextension_view(in_RDI);
  mcu8str_create_from_cstr(c_str);
  return in_RDI;
}

Assistant:

mcu8str mctools_fileextension( const mcu8str* path )
  {
    const char * it = mctools_fileextension_view( path );
    return mcu8str_create_from_cstr( it );
  }